

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

TriggerStep *
sqlite3TriggerDeleteStep(Parse *pParse,Token *pTableName,Expr *pWhere,char *zStart,char *zEnd)

{
  sqlite3 *db_00;
  TriggerStep *pTVar1;
  Expr *pEVar2;
  TriggerStep *pTriggerStep;
  sqlite3 *db;
  char *zEnd_local;
  char *zStart_local;
  Expr *pWhere_local;
  Token *pTableName_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pTVar1 = triggerStepAllocate(pParse,0x80,pTableName,zStart,zEnd);
  zStart_local = (char *)pWhere;
  if (pTVar1 != (TriggerStep *)0x0) {
    if (pParse->eParseMode < 2) {
      pEVar2 = sqlite3ExprDup(db_00,pWhere,1);
      pTVar1->pWhere = pEVar2;
    }
    else {
      pTVar1->pWhere = pWhere;
      zStart_local = (char *)0x0;
    }
    pTVar1->orconf = '\v';
  }
  sqlite3ExprDelete(db_00,(Expr *)zStart_local);
  return pTVar1;
}

Assistant:

SQLITE_PRIVATE TriggerStep *sqlite3TriggerDeleteStep(
  Parse *pParse,          /* Parser */
  Token *pTableName,      /* The table from which rows are deleted */
  Expr *pWhere,           /* The WHERE clause */
  const char *zStart,     /* Start of SQL text */
  const char *zEnd        /* End of SQL text */
){
  sqlite3 *db = pParse->db;
  TriggerStep *pTriggerStep;

  pTriggerStep = triggerStepAllocate(pParse, TK_DELETE, pTableName,zStart,zEnd);
  if( pTriggerStep ){
    if( IN_RENAME_OBJECT ){
      pTriggerStep->pWhere = pWhere;
      pWhere = 0;
    }else{
      pTriggerStep->pWhere = sqlite3ExprDup(db, pWhere, EXPRDUP_REDUCE);
    }
    pTriggerStep->orconf = OE_Default;
  }
  sqlite3ExprDelete(db, pWhere);
  return pTriggerStep;
}